

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtSignatureData::ConvertFromStruct
          (PsbtSignatureData *this,PsbtSignatureDataStruct *data)

{
  PsbtSignatureDataStruct *data_local;
  PsbtSignatureData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->pubkey_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->signature_,(string *)&data->signature);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtSignatureData::ConvertFromStruct(
    const PsbtSignatureDataStruct& data) {
  pubkey_ = data.pubkey;
  signature_ = data.signature;
  ignore_items = data.ignore_items;
}